

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxerManager.cpp
# Opt level: O0

void __thiscall MuxerManager::doMux(MuxerManager *this,string *outFileName,FileFactory *fileFactory)

{
  bool bVar1;
  BufferedFileWriter *pBVar2;
  ostream *this_00;
  reference data;
  WriterData *i;
  iterator __end1;
  iterator __begin1;
  vector<WriterData,_std::allocator<WriterData>_> *__range1;
  _Self local_90;
  int local_84;
  undefined1 auStack_80 [4];
  int avRez;
  AVPacket avPacket;
  FileFactory *fileFactory_local;
  string *outFileName_local;
  MuxerManager *this_local;
  
  preinitMux(this,outFileName,fileFactory);
  pBVar2 = (BufferedFileWriter *)operator_new(0x130);
  BufferedFileWriter::BufferedFileWriter(pBVar2);
  this->m_fileWriter = pBVar2;
  AVPacket::AVPacket((AVPacket *)auStack_80);
  while (local_84 = METADemuxer::readPacket(&this->m_metaDemuxer,(AVPacket *)auStack_80),
        local_84 != 1) {
    if ((this->m_cutStart < 1) || (this->m_cutStart <= _auStack_80)) {
      if ((0 < this->m_cutEnd) && (this->m_cutEnd <= _auStack_80)) break;
      local_90._M_node =
           (_Base_ptr)
           std::set<int,_std::less<int>,_std::allocator<int>_>::find
                     (&this->m_subStreamIndex,(key_type_conflict *)((long)&avPacket.data + 4));
      __range1 = (vector<WriterData,_std::allocator<WriterData>_> *)
                 std::set<int,_std::less<int>,_std::allocator<int>_>::end(&this->m_subStreamIndex);
      bVar1 = std::operator!=(&local_90,(_Self *)&__range1);
      if (bVar1) {
        (*this->m_subMuxer->_vptr_AbstractMuxer[7])(this->m_subMuxer,auStack_80);
      }
      else {
        (*this->m_mainMuxer->_vptr_AbstractMuxer[7])(this->m_mainMuxer,auStack_80);
      }
    }
  }
  this_00 = std::operator<<((ostream *)&std::cout,"Flushing write buffer");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  sLastMsg = true;
  if (this->m_subMuxer != (AbstractMuxer *)0x0) {
    (*this->m_subMuxer->_vptr_AbstractMuxer[3])();
  }
  (*this->m_mainMuxer->_vptr_AbstractMuxer[3])();
  __end1 = std::vector<WriterData,_std::allocator<WriterData>_>::begin(&this->m_delayedData);
  i = (WriterData *)std::vector<WriterData,_std::allocator<WriterData>_>::end(&this->m_delayedData);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<WriterData_*,_std::vector<WriterData,_std::allocator<WriterData>_>_>
                                     *)&i), bVar1) {
    data = __gnu_cxx::
           __normal_iterator<WriterData_*,_std::vector<WriterData,_std::allocator<WriterData>_>_>::
           operator*(&__end1);
    asyncWriteBlock(this,data);
    __gnu_cxx::
    __normal_iterator<WriterData_*,_std::vector<WriterData,_std::allocator<WriterData>_>_>::
    operator++(&__end1);
  }
  waitForWriting(this);
  (*this->m_mainMuxer->_vptr_AbstractMuxer[4])();
  if (this->m_subMuxer != (AbstractMuxer *)0x0) {
    (*this->m_subMuxer->_vptr_AbstractMuxer[4])();
  }
  pBVar2 = this->m_fileWriter;
  if (pBVar2 != (BufferedFileWriter *)0x0) {
    BufferedFileWriter::~BufferedFileWriter(pBVar2);
    operator_delete(pBVar2,0x130);
  }
  this->m_fileWriter = (BufferedFileWriter *)0x0;
  return;
}

Assistant:

void MuxerManager::doMux(const string& outFileName, FileFactory* fileFactory)
{
    preinitMux(outFileName, fileFactory);

    m_fileWriter = new BufferedFileWriter();
    AVPacket avPacket;

    while (true)
    {
        const int avRez = m_metaDemuxer.readPacket(avPacket);

        if (avRez == BufferedReader::DATA_EOF)
            break;
        if (m_cutStart > 0)
        {
            if (avPacket.pts < m_cutStart)
                continue;
        }
        if (m_cutEnd > 0 && avPacket.pts >= m_cutEnd)
            break;

        if (m_subStreamIndex.find(avPacket.stream_index) != m_subStreamIndex.end())
            m_subMuxer->muxPacket(avPacket);
        else
            m_mainMuxer->muxPacket(avPacket);
    }

    LTRACE(LT_INFO, 2, "Flushing write buffer");

    if (m_subMuxer)
        m_subMuxer->doFlush();
    m_mainMuxer->doFlush();

    for (auto& i : m_delayedData) asyncWriteBlock(i);

    waitForWriting();

    m_mainMuxer->close();
    if (m_subMuxer)
        m_subMuxer->close();

    delete m_fileWriter;

    m_fileWriter = nullptr;
}